

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O3

void Omega_h::transfer_inherit_refine<signed_char>
               (Mesh *old_mesh,Mesh *new_mesh,LOs *keys2edges,Int prod_dim,LOs *keys2prods,
               LOs *prods2new_ents,LOs same_ents2old_ents,LOs same_ents2new_ents,string *name)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Int IVar3;
  int iVar4;
  LO n;
  size_t sVar5;
  Alloc *pAVar6;
  Alloc *pAVar7;
  bool bVar8;
  bool bVar9;
  Read<signed_char> dom_data;
  Write<signed_char> prod_data;
  LOs edge_doms2doms;
  LOs edges2edge_doms;
  Graph edges2doms;
  type f;
  LOs local_a0;
  LOs local_90;
  LOs local_80;
  Write<signed_char> local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  Tag<signed_char> *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  element_type *local_48;
  Read<signed_char> local_40;
  
  local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)new_mesh;
  local_48 = (element_type *)prods2new_ents;
  local_58 = Mesh::get_tag<signed_char>
                       (old_mesh,prod_dim,(string *)same_ents2new_ents.write_.shared_alloc_.alloc);
  IVar3 = TagBase::ncomps(&local_58->super_TagBase);
  iVar4 = Read<int>::last(keys2prods);
  f.keys2edges.write_.shared_alloc_.alloc = (Alloc *)&f.keys2prods;
  std::__cxx11::string::_M_construct<char_const*>((string *)&f,"");
  Write<signed_char>::Write(&prod_data,iVar4 * IVar3,(string *)&f);
  if (f.keys2edges.write_.shared_alloc_.alloc != (Alloc *)&f.keys2prods) {
    operator_delete(f.keys2edges.write_.shared_alloc_.alloc,
                    (ulong)((long)&(f.keys2prods.write_.shared_alloc_.alloc)->size + 1));
  }
  pAVar6 = (keys2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar6 & 1) == 0) {
    sVar5 = pAVar6->size;
  }
  else {
    sVar5 = (ulong)pAVar6 >> 3;
  }
  n = (LO)(sVar5 >> 2);
  if (0 < prod_dim) {
    Mesh::get_array<signed_char>((Mesh *)&dom_data,(Int)old_mesh,(string *)(ulong)(uint)prod_dim);
    Mesh::ask_graph(&edges2doms,old_mesh,1,prod_dim);
    pAVar6 = edges2doms.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)edges2doms.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        edges2doms.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        pAVar6 = (Alloc *)((edges2doms.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (edges2doms.a2ab.write_.shared_alloc_.alloc)->use_count =
             (edges2doms.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar7 = edges2doms.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)edges2doms.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        edges2doms.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        pAVar7 = (Alloc *)((edges2doms.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (edges2doms.ab2b.write_.shared_alloc_.alloc)->use_count =
             (edges2doms.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    f.keys2edges.write_.shared_alloc_.alloc = (keys2edges->write_).shared_alloc_.alloc;
    if (((ulong)f.keys2edges.write_.shared_alloc_.alloc & 7) == 0 &&
        f.keys2edges.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        f.keys2edges.write_.shared_alloc_.alloc =
             (Alloc *)((f.keys2edges.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (f.keys2edges.write_.shared_alloc_.alloc)->use_count =
             (f.keys2edges.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    f.keys2edges.write_.shared_alloc_.direct_ptr = (keys2edges->write_).shared_alloc_.direct_ptr;
    f.keys2prods.write_.shared_alloc_.alloc = (keys2prods->write_).shared_alloc_.alloc;
    if (((ulong)f.keys2prods.write_.shared_alloc_.alloc & 7) == 0 &&
        f.keys2prods.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        f.keys2prods.write_.shared_alloc_.alloc =
             (Alloc *)((f.keys2prods.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (f.keys2prods.write_.shared_alloc_.alloc)->use_count =
             (f.keys2prods.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    f.keys2prods.write_.shared_alloc_.direct_ptr = (keys2prods->write_).shared_alloc_.direct_ptr;
    bVar8 = ((ulong)pAVar6 & 7) == 0;
    f.edges2edge_doms.write_.shared_alloc_.alloc = pAVar6;
    if (bVar8 && pAVar6 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        f.edges2edge_doms.write_.shared_alloc_.alloc = (Alloc *)(pAVar6->size * 8 + 1);
      }
      else {
        pAVar6->use_count = pAVar6->use_count + 1;
      }
    }
    f.edges2edge_doms.write_.shared_alloc_.direct_ptr =
         edges2doms.a2ab.write_.shared_alloc_.direct_ptr;
    bVar9 = ((ulong)pAVar7 & 7) == 0;
    f.edge_doms2doms.write_.shared_alloc_.alloc = pAVar7;
    if (bVar9 && pAVar7 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        f.edge_doms2doms.write_.shared_alloc_.alloc = (Alloc *)(pAVar7->size * 8 + 1);
      }
      else {
        pAVar7->use_count = pAVar7->use_count + 1;
      }
    }
    f.edge_doms2doms.write_.shared_alloc_.direct_ptr =
         edges2doms.ab2b.write_.shared_alloc_.direct_ptr;
    f.prod_data.shared_alloc_.alloc = prod_data.shared_alloc_.alloc;
    if (((ulong)prod_data.shared_alloc_.alloc & 7) == 0 &&
        prod_data.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        f.prod_data.shared_alloc_.alloc = (Alloc *)((prod_data.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (prod_data.shared_alloc_.alloc)->use_count = (prod_data.shared_alloc_.alloc)->use_count + 1;
      }
    }
    f.prod_data.shared_alloc_.direct_ptr = prod_data.shared_alloc_.direct_ptr;
    f.dom_data.write_.shared_alloc_.alloc = dom_data.write_.shared_alloc_.alloc;
    if (((ulong)dom_data.write_.shared_alloc_.alloc & 7) == 0 &&
        dom_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        f.dom_data.write_.shared_alloc_.alloc =
             (Alloc *)((dom_data.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (dom_data.write_.shared_alloc_.alloc)->use_count =
             (dom_data.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    f.dom_data.write_.shared_alloc_.direct_ptr = dom_data.write_.shared_alloc_.direct_ptr;
    f.ncomps = IVar3;
    local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(uint)prod_dim;
    parallel_for<Omega_h::transfer_inherit_refine<signed_char>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::_lambda(int)_1_>
              (n,&f,"transfer_inherit_refine(pairs)");
    transfer_inherit_refine<signed_char>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)
    ::{lambda(int)#1}::~basic_string((_lambda_int__1_ *)&f);
    if (bVar9 && pAVar7 != (Alloc *)0x0) {
      piVar1 = &pAVar7->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar7);
        operator_delete(pAVar7,0x48);
      }
    }
    if (bVar8 && pAVar6 != (Alloc *)0x0) {
      piVar1 = &pAVar6->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar6);
        operator_delete(pAVar6,0x48);
      }
    }
    pAVar6 = edges2doms.ab2b.write_.shared_alloc_.alloc;
    prod_dim = (Int)local_60._M_pi;
    if (((ulong)edges2doms.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        edges2doms.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(edges2doms.ab2b.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(edges2doms.ab2b.write_.shared_alloc_.alloc);
        operator_delete(pAVar6,0x48);
      }
    }
    pAVar6 = edges2doms.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)edges2doms.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        edges2doms.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(edges2doms.a2ab.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(edges2doms.a2ab.write_.shared_alloc_.alloc);
        operator_delete(pAVar6,0x48);
      }
    }
    pAVar6 = dom_data.write_.shared_alloc_.alloc;
    if (((ulong)dom_data.write_.shared_alloc_.alloc & 7) == 0 &&
        dom_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(dom_data.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(dom_data.write_.shared_alloc_.alloc);
        operator_delete(pAVar6,0x48);
      }
    }
  }
  if (3 < (uint)old_mesh->dim_) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  if (prod_dim < old_mesh->dim_) {
    Mesh::get_array<signed_char>((Mesh *)&dom_data,(Int)old_mesh,(string *)(ulong)(prod_dim + 1U));
    Mesh::ask_graph(&edges2doms,old_mesh,1,prod_dim + 1U);
    pAVar6 = edges2doms.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)edges2doms.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        edges2doms.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        pAVar6 = (Alloc *)((edges2doms.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (edges2doms.a2ab.write_.shared_alloc_.alloc)->use_count =
             (edges2doms.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar7 = edges2doms.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)edges2doms.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        edges2doms.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        pAVar7 = (Alloc *)((edges2doms.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (edges2doms.ab2b.write_.shared_alloc_.alloc)->use_count =
             (edges2doms.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    f.keys2edges.write_.shared_alloc_.alloc = (keys2edges->write_).shared_alloc_.alloc;
    if (((ulong)f.keys2edges.write_.shared_alloc_.alloc & 7) == 0 &&
        f.keys2edges.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        f.keys2edges.write_.shared_alloc_.alloc =
             (Alloc *)((f.keys2edges.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (f.keys2edges.write_.shared_alloc_.alloc)->use_count =
             (f.keys2edges.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    f.keys2edges.write_.shared_alloc_.direct_ptr = (keys2edges->write_).shared_alloc_.direct_ptr;
    bVar8 = ((ulong)pAVar6 & 7) == 0;
    f.keys2prods.write_.shared_alloc_.alloc = pAVar6;
    if (bVar8 && pAVar6 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        f.keys2prods.write_.shared_alloc_.alloc = (Alloc *)(pAVar6->size * 8 + 1);
      }
      else {
        pAVar6->use_count = pAVar6->use_count + 1;
      }
    }
    f.keys2prods.write_.shared_alloc_.direct_ptr = edges2doms.a2ab.write_.shared_alloc_.direct_ptr;
    f.edges2edge_doms.write_.shared_alloc_.alloc = (keys2prods->write_).shared_alloc_.alloc;
    if (((ulong)f.edges2edge_doms.write_.shared_alloc_.alloc & 7) == 0 &&
        f.edges2edge_doms.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        f.edges2edge_doms.write_.shared_alloc_.alloc =
             (Alloc *)((f.edges2edge_doms.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (f.edges2edge_doms.write_.shared_alloc_.alloc)->use_count =
             (f.edges2edge_doms.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    f.edges2edge_doms.write_.shared_alloc_.direct_ptr =
         (keys2prods->write_).shared_alloc_.direct_ptr;
    bVar9 = ((ulong)pAVar7 & 7) == 0;
    f.edge_doms2doms.write_.shared_alloc_.alloc = pAVar7;
    if (bVar9 && pAVar7 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        f.edge_doms2doms.write_.shared_alloc_.alloc = (Alloc *)(pAVar7->size * 8 + 1);
      }
      else {
        pAVar7->use_count = pAVar7->use_count + 1;
      }
    }
    f.edge_doms2doms.write_.shared_alloc_.direct_ptr =
         edges2doms.ab2b.write_.shared_alloc_.direct_ptr;
    f.prod_data.shared_alloc_.alloc = prod_data.shared_alloc_.alloc;
    if (((ulong)prod_data.shared_alloc_.alloc & 7) == 0 &&
        prod_data.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        f.prod_data.shared_alloc_.alloc = (Alloc *)((prod_data.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (prod_data.shared_alloc_.alloc)->use_count = (prod_data.shared_alloc_.alloc)->use_count + 1;
      }
    }
    f.prod_data.shared_alloc_.direct_ptr = prod_data.shared_alloc_.direct_ptr;
    f.dom_data.write_.shared_alloc_.alloc = dom_data.write_.shared_alloc_.alloc;
    if (((ulong)dom_data.write_.shared_alloc_.alloc & 7) == 0 &&
        dom_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        f.dom_data.write_.shared_alloc_.alloc =
             (Alloc *)((dom_data.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (dom_data.write_.shared_alloc_.alloc)->use_count =
             (dom_data.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    f.dom_data.write_.shared_alloc_.direct_ptr = dom_data.write_.shared_alloc_.direct_ptr;
    f.ncomps = IVar3;
    parallel_for<Omega_h::transfer_inherit_refine<signed_char>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::_lambda(int)_2_>
              (n,(type *)&f,"transfer_inherit_refine(cuts)");
    transfer_inherit_refine<signed_char>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)
    ::{lambda(int)#2}::~basic_string((_lambda_int__2_ *)&f);
    if (bVar9 && pAVar7 != (Alloc *)0x0) {
      piVar1 = &pAVar7->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar7);
        operator_delete(pAVar7,0x48);
      }
    }
    if (bVar8 && pAVar6 != (Alloc *)0x0) {
      piVar1 = &pAVar6->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar6);
        operator_delete(pAVar6,0x48);
      }
    }
    if (((ulong)edges2doms.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        edges2doms.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(edges2doms.ab2b.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(edges2doms.ab2b.write_.shared_alloc_.alloc);
        operator_delete(edges2doms.ab2b.write_.shared_alloc_.alloc,0x48);
      }
    }
    if (((ulong)edges2doms.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        edges2doms.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(edges2doms.a2ab.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(edges2doms.a2ab.write_.shared_alloc_.alloc);
        operator_delete(edges2doms.a2ab.write_.shared_alloc_.alloc,0x48);
      }
    }
    if (((ulong)dom_data.write_.shared_alloc_.alloc & 7) == 0 &&
        dom_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(dom_data.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(dom_data.write_.shared_alloc_.alloc);
        operator_delete(dom_data.write_.shared_alloc_.alloc,0x48);
      }
    }
  }
  local_80.write_.shared_alloc_.alloc =
       (Alloc *)(same_ents2old_ents.write_.shared_alloc_.alloc)->size;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80.write_.shared_alloc_.alloc =
           (Alloc *)((local_80.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_80.write_.shared_alloc_.alloc)->use_count =
           (local_80.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_80.write_.shared_alloc_.direct_ptr =
       ((same_ents2old_ents.write_.shared_alloc_.alloc)->name)._M_dataplus._M_p;
  local_90.write_.shared_alloc_.alloc = *same_ents2old_ents.write_.shared_alloc_.direct_ptr;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90.write_.shared_alloc_.alloc =
           (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_90.write_.shared_alloc_.alloc)->use_count =
           (local_90.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_90.write_.shared_alloc_.direct_ptr =
       *(void **)((long)same_ents2old_ents.write_.shared_alloc_.direct_ptr + 8);
  local_a0.write_.shared_alloc_.alloc = ((SharedAlloc *)&(local_48->super_Graph).a2ab)->alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0.write_.shared_alloc_.alloc =
           (Alloc *)((local_a0.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_a0.write_.shared_alloc_.alloc)->use_count =
           (local_a0.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_a0.write_.shared_alloc_.direct_ptr =
       ((SharedAlloc *)&(local_48->super_Graph).a2ab)->direct_ptr;
  local_70.shared_alloc_.alloc = prod_data.shared_alloc_.alloc;
  if (((ulong)prod_data.shared_alloc_.alloc & 7) == 0 &&
      prod_data.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.shared_alloc_.alloc = (Alloc *)((prod_data.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (prod_data.shared_alloc_.alloc)->use_count = (prod_data.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_70.shared_alloc_.direct_ptr = prod_data.shared_alloc_.direct_ptr;
  Read<signed_char>::Read(&local_40,&local_70);
  transfer_common<signed_char>
            (old_mesh,(Mesh *)local_50._M_pi,prod_dim,&local_80,&local_90,&local_a0,
             &local_58->super_TagBase,&local_40);
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_40.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
      operator_delete(local_40.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar6 = local_70.shared_alloc_.alloc;
  if (((ulong)local_70.shared_alloc_.alloc & 7) == 0 && local_70.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_70.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_70.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  pAVar6 = local_a0.write_.shared_alloc_.alloc;
  if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_a0.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  pAVar6 = local_90.write_.shared_alloc_.alloc;
  if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
      local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_90.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  pAVar6 = local_80.write_.shared_alloc_.alloc;
  if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
      local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_80.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  if (((ulong)prod_data.shared_alloc_.alloc & 7) == 0 &&
      prod_data.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(prod_data.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(prod_data.shared_alloc_.alloc);
      operator_delete(prod_data.shared_alloc_.alloc,0x48);
    }
  }
  return;
}

Assistant:

void transfer_inherit_refine(Mesh* old_mesh, Mesh* new_mesh, LOs keys2edges,
    Int prod_dim, LOs keys2prods, LOs prods2new_ents, LOs same_ents2old_ents,
    LOs same_ents2new_ents, std::string const& name) {
  auto old_tag = old_mesh->get_tag<T>(prod_dim, name);
  auto ncomps = old_tag->ncomps();
  auto nprods = keys2prods.last();
  auto prod_data = Write<T>(nprods * ncomps);
  auto nkeys = keys2edges.size();
  /* transfer pairs */
  if (prod_dim > VERT) {
    auto dom_dim = prod_dim;
    auto dom_data = old_mesh->get_array<T>(dom_dim, name);
    auto edges2doms = old_mesh->ask_graph(EDGE, dom_dim);
    auto edges2edge_doms = edges2doms.a2ab;
    auto edge_doms2doms = edges2doms.ab2b;
    auto f = OMEGA_H_LAMBDA(LO key) {
      auto edge = keys2edges[key];
      auto prod = keys2prods[key];
      for (auto edge_dom = edges2edge_doms[edge];
           edge_dom < edges2edge_doms[edge + 1]; ++edge_dom) {
        auto dom = edge_doms2doms[edge_dom];
        for (Int pair = 0; pair < 2; ++pair) {
          for (Int comp = 0; comp < ncomps; ++comp) {
            prod_data[prod * ncomps + comp] = dom_data[dom * ncomps + comp];
          }
          ++prod;
        }
      }
    };
    parallel_for(nkeys, f, "transfer_inherit_refine(pairs)");
  }
  if (prod_dim < old_mesh->dim()) {
    auto dom_dim = prod_dim + 1;
    auto dom_data = old_mesh->get_array<T>(dom_dim, name);
    auto edges2doms = old_mesh->ask_graph(EDGE, dom_dim);
    auto edges2edge_doms = edges2doms.a2ab;
    auto edge_doms2doms = edges2doms.ab2b;
    auto f = OMEGA_H_LAMBDA(LO key) {
      auto edge = keys2edges[key];
      auto ndoms = edges2edge_doms[edge + 1] - edges2edge_doms[edge];
      auto prod = keys2prods[key + 1] - ndoms;
      for (auto edge_dom = edges2edge_doms[edge];
           edge_dom < edges2edge_doms[edge + 1]; ++edge_dom) {
        auto dom = edge_doms2doms[edge_dom];
        for (Int comp = 0; comp < ncomps; ++comp) {
          prod_data[prod * ncomps + comp] = dom_data[dom * ncomps + comp];
        }
        ++prod;
      }
    };
    parallel_for(nkeys, f, "transfer_inherit_refine(cuts)");
  }
  transfer_common(old_mesh, new_mesh, prod_dim, same_ents2old_ents,
      same_ents2new_ents, prods2new_ents, old_tag, Read<T>(prod_data));
}